

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSeparation.cpp
# Opt level: O0

void __thiscall HighsSeparation::separate(HighsSeparation *this,HighsDomain *propdomain)

{
  bool bVar1;
  pointer pHVar2;
  int64_t iVar3;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar4;
  double *pdVar5;
  long in_RDI;
  double dVar6;
  bool in_stack_0000000f;
  HighsLpRelaxation *in_stack_00000010;
  HighsInt ncuts;
  size_t nlpiters;
  double lastobj;
  double firstobj;
  HighsMipSolver *mipsolver;
  Status status;
  Status *in_stack_00000178;
  HighsDomain *in_stack_00000180;
  HighsSeparation *in_stack_00000188;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffffa0;
  double local_48;
  HighsInt local_3c;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_38;
  double local_30;
  double local_28;
  HighsMipSolver *local_20;
  Status local_14;
  
  local_14 = HighsLpRelaxation::getStatus(*(HighsLpRelaxation **)(in_RDI + 0xb0));
  local_20 = HighsLpRelaxation::getMipSolver(*(HighsLpRelaxation **)(in_RDI + 0xb0));
  bVar1 = HighsLpRelaxation::scaledOptimal(local_14);
  if (bVar1) {
    HighsLpRelaxation::getFractionalIntegers(*(HighsLpRelaxation **)(in_RDI + 0xb0));
    bVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::empty
                      (in_stack_ffffffffffffffa0);
    if (!bVar1) {
      pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x69f514);
      local_28 = pHVar2->rootlpsolobj;
      while( true ) {
        dVar6 = HighsLpRelaxation::getObjective(*(HighsLpRelaxation **)(in_RDI + 0xb0));
        pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x69f54a);
        if (pHVar2->optimality_limit <= dVar6) {
          return;
        }
        local_30 = HighsLpRelaxation::getObjective(*(HighsLpRelaxation **)(in_RDI + 0xb0));
        iVar3 = HighsLpRelaxation::getNumLpIterations(*(HighsLpRelaxation **)(in_RDI + 0xb0));
        local_38 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   -iVar3;
        local_3c = separationRound(in_stack_00000188,in_stack_00000180,in_stack_00000178);
        iVar3 = HighsLpRelaxation::getNumLpIterations(*(HighsLpRelaxation **)(in_RDI + 0xb0));
        pvVar4 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 (iVar3 + (long)local_38);
        local_38 = pvVar4;
        pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x69f5e7);
        pHVar2->sepa_lp_iterations =
             (long)&(pvVar4->
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + pHVar2->sepa_lp_iterations;
        pvVar4 = local_38;
        pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x69f615);
        pHVar2->total_lp_iterations =
             (long)&(pvVar4->
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + pHVar2->total_lp_iterations;
        if (local_3c == 0) {
          return;
        }
        bVar1 = HighsLpRelaxation::scaledOptimal(local_14);
        if (!bVar1) {
          return;
        }
        HighsLpRelaxation::getFractionalIntegers(*(HighsLpRelaxation **)(in_RDI + 0xb0));
        bVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::empty
                          (pvVar4);
        if (bVar1) break;
        dVar6 = HighsLpRelaxation::getObjective(*(HighsLpRelaxation **)(in_RDI + 0xb0));
        dVar6 = dVar6 - local_28;
        local_48 = local_30 - local_28;
        pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x69f69f);
        pdVar5 = std::max<double>(&local_48,&pHVar2->feastol);
        if (dVar6 <= *pdVar5 * 1.01) {
          return;
        }
      }
      return;
    }
  }
  HighsLpRelaxation::performAging(in_stack_00000010,in_stack_0000000f);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x69f6fb);
  HighsCutPool::performAging((HighsCutPool *)in_stack_00000010);
  return;
}

Assistant:

void HighsSeparation::separate(HighsDomain& propdomain) {
  HighsLpRelaxation::Status status = lp->getStatus();
  const HighsMipSolver& mipsolver = lp->getMipSolver();

  if (lp->scaledOptimal(status) && !lp->getFractionalIntegers().empty()) {
    // double firstobj = lp->getObjective();
    double firstobj = mipsolver.mipdata_->rootlpsolobj;

    while (lp->getObjective() < mipsolver.mipdata_->optimality_limit) {
      double lastobj = lp->getObjective();

      size_t nlpiters = -lp->getNumLpIterations();
      HighsInt ncuts = separationRound(propdomain, status);
      nlpiters += lp->getNumLpIterations();
      mipsolver.mipdata_->sepa_lp_iterations += nlpiters;
      mipsolver.mipdata_->total_lp_iterations += nlpiters;
      // printf("separated %" HIGHSINT_FORMAT " cuts\n", ncuts);

      // printf(
      //     "separation round %" HIGHSINT_FORMAT " at node %" HIGHSINT_FORMAT "
      //     added %" HIGHSINT_FORMAT " cuts objective changed " "from %g to %g,
      //     first obj is %g\n", nrounds, (HighsInt)nnodes, ncuts, lastobj,
      //     lp->getObjective(), firstobj);
      if (ncuts == 0 || !lp->scaledOptimal(status) ||
          lp->getFractionalIntegers().empty())
        break;

      // if the objective improved considerably we continue
      if ((lp->getObjective() - firstobj) <=
          std::max((lastobj - firstobj), mipsolver.mipdata_->feastol) * 1.01)
        break;
    }

    // printf("done separating\n");
  } else {
    // printf("no separation, just aging. status: %" HIGHSINT_FORMAT "\n",
    //        (HighsInt)status);
    lp->performAging(true);
    mipsolver.mipdata_->cutpool.performAging();
  }
}